

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestNamer.cpp
# Opt level: O0

string * __thiscall
CppUnit::TestNamer::getTestNameFor
          (string *__return_storage_ptr__,TestNamer *this,string *testMethodName)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  string *local_20;
  string *testMethodName_local;
  TestNamer *this_local;
  
  local_20 = testMethodName;
  testMethodName_local = (string *)this;
  this_local = (TestNamer *)__return_storage_ptr__;
  (*this->_vptr_TestNamer[2])();
  std::operator+(&local_40,&local_60,"::");
  std::operator+(__return_storage_ptr__,&local_40,local_20);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

std::string 
TestNamer::getTestNameFor( const std::string &testMethodName ) const
{
  return getFixtureName() + "::" + testMethodName;
}